

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_files.h
# Opt level: O2

int cf_read_file(cf_dir_t *dir,cf_file_t *file)

{
  int iVar1;
  uint uVar2;
  int in_R9D;
  
  if (dir->entry != (dirent *)0x0) {
    iVar1 = cf_safe_strcpy_internal(file->path,dir->path,0,0x400,(char *)0x17d,in_R9D);
    iVar1 = cf_safe_strcpy_internal(file->path,"/",iVar1 + -1,0x400,(char *)0x17e,in_R9D);
    cf_safe_strcpy_internal(file->name,dir->entry->d_name,0,0x100,(char *)0x183,in_R9D);
    cf_safe_strcpy_internal(file->path,file->name,iVar1 + -1,0x400,(char *)0x184,in_R9D);
    iVar1 = stat(file->path,(stat *)&file->info);
    if (iVar1 == 0) {
      file->size = (int)(file->info).st_size;
      cf_get_ext(file);
      uVar2 = (file->info).st_mode & 0xf000;
      file->is_dir = -(uint)(uVar2 == 0x4000) >> 0x1f;
      file->is_reg = -(uint)(uVar2 == 0x8000) >> 0x1f;
    }
    return (uint)(iVar1 == 0);
  }
  __assert_fail("dir->entry",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/cute/cute_files.h"
                ,0x177,"int cf_read_file(cf_dir_t *, cf_file_t *)");
}

Assistant:

int cf_read_file(cf_dir_t* dir, cf_file_t* file)
	{
		CUTE_FILES_ASSERT(dir->entry);

		int n = 0;
		char* fpath = file->path;
		char* dpath = dir->path;

		n = cf_safe_strcpy(fpath, dpath, 0, CUTE_FILES_MAX_PATH);
		n = cf_safe_strcpy(fpath, "/", n - 1, CUTE_FILES_MAX_PATH);

		char* dname = dir->entry->d_name;
		char* fname = file->name;

		cf_safe_strcpy(fname, dname, 0, CUTE_FILES_MAX_FILENAME);
		cf_safe_strcpy(fpath, fname, n - 1, CUTE_FILES_MAX_PATH);

		if (stat(file->path, &file->info))
			return 0;

		file->size = file->info.st_size;
		cf_get_ext(file);

		file->is_dir = S_ISDIR(file->info.st_mode);
		file->is_reg = S_ISREG(file->info.st_mode);

		return 1;
	}